

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-write-queue-order.c
# Opt level: O2

int run_test_tcp_write_queue_order(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  undefined8 uStack_90;
  int buffer_size;
  sockaddr_in addr;
  uv_connect_t connect_req;
  
  buffer_size = 0x4000;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,(sockaddr_in *)&connect_req);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_tcp_init(puVar2,&server);
    if (iVar1 == 0) {
      iVar1 = uv_tcp_bind(&server,(sockaddr *)&connect_req,0);
      if (iVar1 == 0) {
        iVar1 = uv_listen((uv_stream_t *)&server,0x80,connection_cb);
        if (iVar1 == 0) {
          iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
          if (iVar1 == 0) {
            puVar2 = uv_default_loop();
            iVar1 = uv_tcp_init(puVar2,&client);
            if (iVar1 == 0) {
              iVar1 = uv_tcp_connect(&connect_req,&client,(sockaddr *)&addr,connect_cb);
              if (iVar1 == 0) {
                iVar1 = uv_send_buffer_size((uv_handle_t *)&client,&buffer_size);
                if (iVar1 == 0) {
                  puVar2 = uv_default_loop();
                  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
                  if (iVar1 == 0) {
                    if (connect_cb_called == 1) {
                      if (connection_cb_called == 1) {
                        if (write_callbacks < 1) {
                          pcVar3 = "write_callbacks > 0";
                          uStack_90 = 0x82;
                        }
                        else if (write_cancelled_callbacks < 1) {
                          pcVar3 = "write_cancelled_callbacks > 0";
                          uStack_90 = 0x83;
                        }
                        else if (write_cancelled_callbacks + write_callbacks + write_error_callbacks
                                 == 10000) {
                          if (close_cb_called == 3) {
                            puVar2 = uv_default_loop();
                            uv_walk(puVar2,close_walk_cb,(void *)0x0);
                            uv_run(puVar2,UV_RUN_DEFAULT);
                            puVar2 = uv_default_loop();
                            iVar1 = uv_loop_close(puVar2);
                            if (iVar1 == 0) {
                              return 0;
                            }
                            pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                            uStack_90 = 0x89;
                          }
                          else {
                            pcVar3 = "close_cb_called == 3";
                            uStack_90 = 0x87;
                          }
                        }
                        else {
                          pcVar3 = 
                          "write_callbacks + write_error_callbacks + write_cancelled_callbacks == REQ_COUNT"
                          ;
                          uStack_90 = 0x86;
                        }
                      }
                      else {
                        pcVar3 = "connection_cb_called == 1";
                        uStack_90 = 0x81;
                      }
                    }
                    else {
                      pcVar3 = "connect_cb_called == 1";
                      uStack_90 = 0x80;
                    }
                  }
                  else {
                    pcVar3 = "0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
                    uStack_90 = 0x7e;
                  }
                }
                else {
                  pcVar3 = "0 == uv_send_buffer_size((uv_handle_t*) &client, &buffer_size)";
                  uStack_90 = 0x7c;
                }
              }
              else {
                pcVar3 = 
                "0 == uv_tcp_connect(&connect_req, &client, (struct sockaddr*) &addr, connect_cb)";
                uStack_90 = 0x7b;
              }
            }
            else {
              pcVar3 = "0 == uv_tcp_init(uv_default_loop(), &client)";
              uStack_90 = 0x77;
            }
          }
          else {
            pcVar3 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
            uStack_90 = 0x75;
          }
        }
        else {
          pcVar3 = "0 == uv_listen((uv_stream_t*) &server, 128, connection_cb)";
          uStack_90 = 0x6a;
        }
      }
      else {
        pcVar3 = "0 == uv_tcp_bind(&server, (struct sockaddr*) &addr, 0)";
        uStack_90 = 0x69;
      }
    }
    else {
      pcVar3 = "0 == uv_tcp_init(uv_default_loop(), &server)";
      uStack_90 = 0x68;
    }
  }
  else {
    pcVar3 = "0 == uv_ip4_addr(\"0.0.0.0\", TEST_PORT, &addr)";
    uStack_90 = 0x66;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-write-queue-order.c"
          ,uStack_90,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(tcp_write_queue_order) {
  uv_connect_t connect_req;
  struct sockaddr_in addr;
  int buffer_size = 16 * 1024;

  start_server();

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  ASSERT(0 == uv_tcp_init(uv_default_loop(), &client));
  ASSERT(0 == uv_tcp_connect(&connect_req,
                             &client,
                             (struct sockaddr*) &addr,
                             connect_cb));
  ASSERT(0 == uv_send_buffer_size((uv_handle_t*) &client, &buffer_size));

  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT(connect_cb_called == 1);
  ASSERT(connection_cb_called == 1);
  ASSERT(write_callbacks > 0);
  ASSERT(write_cancelled_callbacks > 0);
  ASSERT(write_callbacks +
         write_error_callbacks +
         write_cancelled_callbacks == REQ_COUNT);
  ASSERT(close_cb_called == 3);

  MAKE_VALGRIND_HAPPY();
  return 0;
}